

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_server.cc
# Opt level: O3

char * bssl::ssl_server_handshake_state(SSL_HANDSHAKE *hs)

{
  char *pcVar1;
  
  switch(hs->state) {
  case 0:
    return "TLS server start_accept";
  case 1:
    return "TLS server read_client_hello";
  case 2:
    return "TLS server read_client_hello_after_ech";
  case 3:
    return "TLS server cert_callback";
  case 4:
    pcVar1 = tls13_server_handshake_state(hs);
    return pcVar1;
  case 5:
    return "TLS server select_parameters";
  case 6:
    return "TLS server send_server_hello";
  case 7:
    return "TLS server send_server_certificate";
  case 8:
    return "TLS server send_server_key_exchange";
  case 9:
    return "TLS server send_server_hello_done";
  case 10:
    return "TLS server read_client_certificate";
  case 0xb:
    return "TLS server verify_client_certificate";
  case 0xc:
    return "TLS server read_client_key_exchange";
  case 0xd:
    return "TLS server read_client_certificate_verify";
  case 0xe:
    return "TLS server read_change_cipher_spec";
  case 0xf:
    return "TLS server process_change_cipher_spec";
  case 0x10:
    return "TLS server read_next_proto";
  case 0x11:
    return "TLS server read_channel_id";
  case 0x12:
    return "TLS server read_client_finished";
  case 0x13:
    return "TLS server send_server_finished";
  case 0x14:
    return "TLS server finish_server_handshake";
  case 0x15:
    return "TLS server done";
  default:
    return "TLS server unknown";
  }
}

Assistant:

const char *ssl_server_handshake_state(SSL_HANDSHAKE *hs) {
  enum tls12_server_hs_state_t state =
      static_cast<enum tls12_server_hs_state_t>(hs->state);
  switch (state) {
    case state12_start_accept:
      return "TLS server start_accept";
    case state12_read_client_hello:
      return "TLS server read_client_hello";
    case state12_read_client_hello_after_ech:
      return "TLS server read_client_hello_after_ech";
    case state12_cert_callback:
      return "TLS server cert_callback";
    case state12_tls13:
      return tls13_server_handshake_state(hs);
    case state12_select_parameters:
      return "TLS server select_parameters";
    case state12_send_server_hello:
      return "TLS server send_server_hello";
    case state12_send_server_certificate:
      return "TLS server send_server_certificate";
    case state12_send_server_key_exchange:
      return "TLS server send_server_key_exchange";
    case state12_send_server_hello_done:
      return "TLS server send_server_hello_done";
    case state12_read_client_certificate:
      return "TLS server read_client_certificate";
    case state12_verify_client_certificate:
      return "TLS server verify_client_certificate";
    case state12_read_client_key_exchange:
      return "TLS server read_client_key_exchange";
    case state12_read_client_certificate_verify:
      return "TLS server read_client_certificate_verify";
    case state12_read_change_cipher_spec:
      return "TLS server read_change_cipher_spec";
    case state12_process_change_cipher_spec:
      return "TLS server process_change_cipher_spec";
    case state12_read_next_proto:
      return "TLS server read_next_proto";
    case state12_read_channel_id:
      return "TLS server read_channel_id";
    case state12_read_client_finished:
      return "TLS server read_client_finished";
    case state12_send_server_finished:
      return "TLS server send_server_finished";
    case state12_finish_server_handshake:
      return "TLS server finish_server_handshake";
    case state12_done:
      return "TLS server done";
  }

  return "TLS server unknown";
}